

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::ActionBuf::deserialize(ActionBuf *this,A2A *a2a)

{
  Action *pAVar1;
  int iVar2;
  size_type sVar3;
  size_t sVar4;
  int iVar5;
  reference pvVar6;
  size_type sVar7;
  bool local_5d;
  Kind local_4c;
  reference pvStack_48;
  uint kind;
  Action *a;
  size_t j;
  size_type sStack_30;
  int p_1;
  size_t i;
  uint dummy;
  int p;
  size_t n;
  A2A *a2a_local;
  ActionBuf *this_local;
  
  _dummy = 0;
  this->m_dummy_bsmp = 1;
  n = (size_t)a2a;
  a2a_local = (A2A *)this;
  for (i._4_4_ = 0; iVar2 = i._4_4_, iVar5 = A2A::nprocs((A2A *)n), iVar2 < iVar5;
      i._4_4_ = i._4_4_ + 1) {
    deserial<unsigned_int>((A2A *)n,i._4_4_,(uint *)&i);
    sVar4 = n;
    iVar2 = i._4_4_;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_get_buffer_offset,(long)i._4_4_);
    deserial<unsigned_long>((A2A *)sVar4,iVar2,pvVar6);
    sVar4 = n;
    iVar2 = i._4_4_;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_counts,(long)i._4_4_);
    deserial<unsigned_long>((A2A *)sVar4,iVar2,pvVar6);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_counts,(long)i._4_4_);
    _dummy = *pvVar6 + _dummy;
    local_5d = this->m_dummy_bsmp != 0 && (int)i != 0;
    this->m_dummy_bsmp = (uint)local_5d;
  }
  std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::resize
            (&this->m_actions,_dummy);
  sStack_30 = 0;
  for (j._4_4_ = 0; iVar2 = j._4_4_, iVar5 = A2A::nprocs((A2A *)n), sVar3 = sStack_30, iVar2 < iVar5
      ; j._4_4_ = j._4_4_ + 1) {
    for (a = (Action *)0x0; pAVar1 = a,
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_counts,(long)j._4_4_), sVar3 = sStack_30,
        pAVar1 < (Action *)*pvVar6; a = (Action *)((long)&a->kind + 1)) {
      sStack_30 = sStack_30 + 1;
      pvStack_48 = std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::
                   operator[](&this->m_actions,sVar3);
      pvStack_48->target_pid = j._4_4_;
      deserial<unsigned_int>((A2A *)n,j._4_4_,&local_4c);
      pvStack_48->kind = local_4c;
      deserial<int>((A2A *)n,j._4_4_,&pvStack_48->src_pid);
      deserial<int>((A2A *)n,j._4_4_,&pvStack_48->dst_pid);
      deserial<int>((A2A *)n,j._4_4_,&pvStack_48->tag);
      deserial<unsigned_long>((A2A *)n,j._4_4_,&pvStack_48->src_slot);
      deserial<unsigned_long>((A2A *)n,j._4_4_,&pvStack_48->dst_slot);
      deserial<unsigned_long>((A2A *)n,j._4_4_,&pvStack_48->offset);
      deserial<unsigned_long>((A2A *)n,j._4_4_,&pvStack_48->size);
    }
  }
  sVar7 = std::vector<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>::size
                    (&this->m_actions);
  if (sVar3 == sVar7) {
    return;
  }
  __assert_fail("i == m_actions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                ,0x13e,"void bsplib::Rdma::ActionBuf::deserialize(A2A &)");
}

Assistant:

void Rdma::ActionBuf::deserialize( A2A & a2a ) 
{
    size_t n = 0;
    m_dummy_bsmp = true;
    for (int p = 0; p < a2a.nprocs(); ++p )
    {
        unsigned dummy;
        deserial( a2a, p, dummy );
        deserial( a2a, p, m_get_buffer_offset[ p ] );
        deserial( a2a, p, m_counts[ p ] );
        n += m_counts[p];
        m_dummy_bsmp = m_dummy_bsmp && dummy;
    }
    m_actions.resize( n );

    size_t i = 0;
    for (int p = 0; p < a2a.nprocs(); ++p )
    {
        for (size_t j = 0; j < m_counts[p]; ++j) {
            Action & a = m_actions[i++];
            a.target_pid = p;
            unsigned kind;
            deserial( a2a, p, kind );
            a.kind = Action::Kind(kind);
#ifdef PROFILE
            TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
#endif
            deserial( a2a, p, a.src_pid );
            deserial( a2a, p, a.dst_pid );
            deserial( a2a, p, a.tag );
            deserial( a2a, p, a.src_slot );
            deserial( a2a, p, a.dst_slot );
            deserial( a2a, p, a.offset );
            deserial( a2a, p, a.size );
        }
    }
    assert( i == m_actions.size() );
}